

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,int _h,int _c,Allocator *allocator)

{
  size_t _elemsize;
  int *piVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  Mat tmp;
  Mat local_68;
  
  iVar4 = _h * _w;
  if (this->h * this->w * this->c == iVar4 * _c) {
    iVar2 = this->dims;
    lVar3 = (long)iVar4;
    if (iVar2 < 3) {
      _elemsize = this->elemsize;
      if ((long)_h * (long)_w - (_elemsize * lVar3 + 0xf & 0xfffffffffffffff0) / _elemsize != 0) {
        __return_storage_ptr__->dims = 0;
        __return_storage_ptr__->w = 0;
        __return_storage_ptr__->h = 0;
        __return_storage_ptr__->c = 0;
        __return_storage_ptr__->elemsize = 0;
        __return_storage_ptr__->allocator = (Allocator *)0x0;
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->refcount = (int *)0x0;
        __return_storage_ptr__->cstep = 0;
        create(__return_storage_ptr__,_w,_h,_c,_elemsize,allocator);
        if (_c < 1) {
          return __return_storage_ptr__;
        }
        iVar2 = 0;
        uVar5 = 0;
        do {
          memcpy((void *)(__return_storage_ptr__->cstep * uVar5 * __return_storage_ptr__->elemsize +
                         (long)__return_storage_ptr__->data),
                 (void *)(this->elemsize * (long)iVar2 + (long)this->data),this->elemsize * lVar3);
          uVar5 = uVar5 + 1;
          iVar2 = iVar2 + iVar4;
        } while ((uint)_c != uVar5);
        return __return_storage_ptr__;
      }
    }
    else if (this->c != _c) {
      reshape(&local_68,this,iVar4 * _c,allocator);
      reshape(__return_storage_ptr__,&local_68,_w,_h,_c,allocator);
      if (local_68.refcount == (int *)0x0) {
        return __return_storage_ptr__;
      }
      LOCK();
      *local_68.refcount = *local_68.refcount + -1;
      UNLOCK();
      if (*local_68.refcount != 0) {
        return __return_storage_ptr__;
      }
      if (local_68.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_68.allocator + 8))();
        return __return_storage_ptr__;
      }
      if (local_68.data == (void *)0x0) {
        return __return_storage_ptr__;
      }
      free(*(void **)((long)local_68.data + -8));
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->data = this->data;
    piVar1 = this->refcount;
    __return_storage_ptr__->refcount = piVar1;
    __return_storage_ptr__->elemsize = this->elemsize;
    __return_storage_ptr__->allocator = this->allocator;
    __return_storage_ptr__->dims = iVar2;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    iVar4 = this->h;
    __return_storage_ptr__->w = this->w;
    __return_storage_ptr__->h = iVar4;
    __return_storage_ptr__->c = this->c;
    __return_storage_ptr__->cstep = this->cstep;
    __return_storage_ptr__->dims = 3;
    __return_storage_ptr__->w = _w;
    __return_storage_ptr__->h = _h;
    __return_storage_ptr__->c = _c;
    __return_storage_ptr__->cstep =
         (lVar3 * this->elemsize + 0xf & 0xfffffffffffffff0) / this->elemsize;
  }
  else {
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->elemsize = 0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, int _h, int _c, Allocator* allocator) const
{
    if (w * h * c != _w * _h * _c)
        return Mat();

    if (dims < 3)
    {
        if ((size_t)_w * _h != alignSize(_w * _h * elemsize, 16) / elemsize)
        {
            Mat m;
            m.create(_w, _h, _c, elemsize, allocator);

            // align channel
            for (int i=0; i<_c; i++)
            {
                const void* ptr = (unsigned char*)data + i * _w * _h * elemsize;
                void* mptr = (unsigned char*)m.data + i * m.cstep * m.elemsize;
                memcpy(mptr, ptr, _w * _h * elemsize);
            }

            return m;
        }
    }
    else if (c != _c)
    {
        // flatten and then align
        Mat tmp = reshape(_w * _h * _c, allocator);
        return tmp.reshape(_w, _h, _c, allocator);
    }

    Mat m = *this;

    m.dims = 3;
    m.w = _w;
    m.h = _h;
    m.c = _c;

    m.cstep = alignSize(_w * _h * elemsize, 16) / elemsize;

    return m;
}